

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_interactor.cpp
# Opt level: O0

void Am_Animation_Start_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  Am_Value *pAVar1;
  Am_Object local_40;
  Am_Object command_obj;
  Am_Inter_Internal_Method inter_method;
  Am_Input_Event *ev_local;
  Am_Object *event_window_local;
  Am_Object *object_local;
  Am_Object *inter_local;
  
  Am_Inter_Internal_Method::Am_Inter_Internal_Method((Am_Inter_Internal_Method *)&command_obj);
  pAVar1 = Am_Object::Get(&Am_Interactor,0xbe,0);
  Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&command_obj,pAVar1);
  (*(code *)inter_method.from_wrapper)(inter,object,event_window,ev);
  Am_Object::Am_Object(&local_40);
  pAVar1 = Am_Object::Get(inter,0xc5,0);
  Am_Object::operator=(&local_40,pAVar1);
  Am_Inter_Call_Both_Method
            (inter,&local_40,199,ev->x,ev->y,event_window,&ev->input_char,object,&Am_No_Location);
  Am_Object::~Am_Object(&local_40);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Animation_Start_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  Am_INTER_TRACE_PRINT(inter, "Animation starting over " << object);

  // first, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_START_METHOD);
  inter_method.Call(inter, object, event_window, ev);

  Am_Object command_obj;
  command_obj = inter.Get(Am_COMMAND);
  Am_Inter_Call_Both_Method(inter, command_obj, Am_START_DO_METHOD, ev->x,
                            ev->y, event_window, ev->input_char, object,
                            Am_No_Location);
}